

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitSIMDReplace(PrintExpressionContents *this,SIMDReplace *curr)

{
  ostream *poVar1;
  
  poVar1 = this->o;
  Colors::outputColorCode(poVar1,"\x1b[35m");
  Colors::outputColorCode(poVar1,"\x1b[1m");
  if ((ulong)curr->op < 7) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->o,&DAT_00e1d8c8 + *(int *)(&DAT_00e1d8c8 + (ulong)curr->op * 4),0x12);
  }
  Colors::outputColorCode(this->o,"\x1b[0m");
  poVar1 = this->o;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::operator<<(poVar1,(uint)curr->index);
  return;
}

Assistant:

void visitSIMDReplace(SIMDReplace* curr) {
    prepareColor(o);
    switch (curr->op) {
      case ReplaceLaneVecI8x16:
        o << "i8x16.replace_lane";
        break;
      case ReplaceLaneVecI16x8:
        o << "i16x8.replace_lane";
        break;
      case ReplaceLaneVecI32x4:
        o << "i32x4.replace_lane";
        break;
      case ReplaceLaneVecI64x2:
        o << "i64x2.replace_lane";
        break;
      case ReplaceLaneVecF16x8:
        o << "f16x8.replace_lane";
        break;
      case ReplaceLaneVecF32x4:
        o << "f32x4.replace_lane";
        break;
      case ReplaceLaneVecF64x2:
        o << "f64x2.replace_lane";
        break;
    }
    restoreNormalColor(o);
    o << " " << int(curr->index);
  }